

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v5::internal::
          format_decimal<unsigned_long,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (wchar_t *buffer,unsigned_long value,int num_digits,
                    add_thousands_sep<wchar_t> thousands_sep)

{
  wchar_t *pwVar1;
  bool bVar2;
  assertion_failure *this;
  wchar_t wVar3;
  ulong uVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  
  if (num_digits < 0) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"invalid digit count");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  pwVar1 = buffer + (uint)num_digits;
  uVar4 = value;
  pwVar5 = pwVar1;
  if (99 < value) {
    do {
      value = uVar4 / 100;
      uVar6 = (ulong)(uint)(((int)uVar4 + (int)value * -100) * 2);
      pwVar5[-1] = (int)(char)basic_data<void>::DIGITS[uVar6 + 1];
      pwVar5 = pwVar5 + -1;
      if ((thousands_sep.digit_index_ + 1) * -0x55555555 < 0x55555556) {
        pwVar5 = pwVar5 + -thousands_sep.sep_.size_;
        if (thousands_sep.sep_.size_ != 0) {
          memmove(pwVar5,thousands_sep.sep_.data_,thousands_sep.sep_.size_ * 4);
        }
      }
      pwVar5[-1] = (int)(char)basic_data<void>::DIGITS[uVar6];
      pwVar5 = pwVar5 + -1;
      thousands_sep.digit_index_ = thousands_sep.digit_index_ + 2;
      if (thousands_sep.digit_index_ * -0x55555555 < 0x55555556) {
        pwVar5 = pwVar5 + -thousands_sep.sep_.size_;
        if (thousands_sep.sep_.size_ != 0) {
          memmove(pwVar5,thousands_sep.sep_.data_,thousands_sep.sep_.size_ * 4);
        }
      }
      bVar2 = 9999 < uVar4;
      uVar4 = value;
    } while (bVar2);
  }
  if (value < 10) {
    wVar3 = (uint)value | 0x30;
  }
  else {
    uVar4 = (value & 0xffffffff) * 2;
    pwVar5[-1] = (int)(char)basic_data<void>::DIGITS[(uVar4 & 0xffffffff) + 1];
    pwVar5 = pwVar5 + -1;
    if (thousands_sep.digit_index_ * -0x55555555 + 0xaaaaaaab < 0x55555556) {
      pwVar5 = pwVar5 + -thousands_sep.sep_.size_;
      if (thousands_sep.sep_.size_ != 0) {
        memmove(pwVar5,thousands_sep.sep_.data_,thousands_sep.sep_.size_ * 4);
      }
    }
    wVar3 = (wchar_t)(char)basic_data<void>::DIGITS[uVar4];
  }
  pwVar5[-1] = wVar3;
  return pwVar1;
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}